

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O0

void __thiscall wasm::Wasm2JSGlue::emitPreES6(Wasm2JSGlue *this)

{
  __node_base_ptr *this_00;
  char local_141;
  pointer *local_140;
  pointer *local_138;
  pointer *local_130;
  undefined1 local_118 [8];
  ImportInfo imports;
  anon_class_24_3_09f8b868 noteImport;
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  seenModules;
  unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  baseModuleMap;
  Wasm2JSGlue *this_local;
  
  this_00 = &seenModules._M_h._M_single_bucket;
  std::
  unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  ::unordered_map((unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                   *)this_00);
  std::
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  ::unordered_set((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)&noteImport.this);
  imports.importedTags.super__Vector_base<wasm::Tag_*,_std::allocator<wasm::Tag_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this_00;
  noteImport.baseModuleMap =
       (unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
        *)&noteImport.this;
  noteImport.seenModules =
       (unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
        *)this;
  ImportInfo::ImportInfo((ImportInfo *)local_118,this->wasm);
  local_130 = &imports.importedTags.super__Vector_base<wasm::Tag_*,_std::allocator<wasm::Tag_*>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
  ModuleUtils::iterImportedGlobals<wasm::Wasm2JSGlue::emitPreES6()::__0>
            (this->wasm,(anon_class_8_1_52571bf5)local_130);
  local_138 = &imports.importedTags.super__Vector_base<wasm::Tag_*,_std::allocator<wasm::Tag_*>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
  ModuleUtils::iterImportedTables<wasm::Wasm2JSGlue::emitPreES6()::__1>
            (this->wasm,(anon_class_8_1_52571bf5)local_138);
  local_140 = &imports.importedTags.super__Vector_base<wasm::Tag_*,_std::allocator<wasm::Tag_*>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
  ModuleUtils::iterImportedFunctions<wasm::Wasm2JSGlue::emitPreES6()::__2>
            (this->wasm,(anon_class_8_1_52571bf5)local_140);
  local_141 = '\n';
  Output::operator<<(this->out,&local_141);
  ImportInfo::~ImportInfo((ImportInfo *)local_118);
  std::
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~unordered_set((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                    *)&noteImport.this);
  std::
  unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  ::~unordered_map((unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                    *)&seenModules._M_h._M_single_bucket);
  return;
}

Assistant:

void Wasm2JSGlue::emitPreES6() {
  std::unordered_map<Name, Name> baseModuleMap;
  std::unordered_set<Name> seenModules;

  auto noteImport = [&](Name module, Name base) {
    // Right now codegen requires a flat namespace going into the module,
    // meaning we don't support importing the same name from multiple namespaces
    // yet.
    if (baseModuleMap.count(base) && baseModuleMap[base] != module) {
      Fatal() << "the name " << base << " cannot be imported from "
              << "two different modules yet";
    }
    baseModuleMap[base] = module;
    if (seenModules.count(module) == 0) {
      out << "import * as " << asmangle(module.toString()) << " from '"
          << module << "';\n";
      seenModules.insert(module);
    }
  };

  ImportInfo imports(wasm);

  ModuleUtils::iterImportedGlobals(
    wasm, [&](Global* import) { noteImport(import->module, import->base); });
  ModuleUtils::iterImportedTables(
    wasm, [&](Table* import) { noteImport(import->module, import->base); });
  ModuleUtils::iterImportedFunctions(wasm, [&](Function* import) {
    // The special helpers are emitted in the glue, see code and comments
    // below.
    if (ABI::wasm2js::isHelper(import->base)) {
      return;
    }
    noteImport(import->module, import->base);
  });

  out << '\n';
}